

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

void __thiscall Task::clear(Task *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pOVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pOVar4;
  
  this->time_stamp = 0;
  this->execution_memory = 0;
  pOVar2 = (this->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar4 = (this->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                super__Vector_impl_data._M_start; pOVar4 != pOVar2; pOVar4 = pOVar4 + 1) {
    p_Var3 = (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    pOVar4->version =
         (long)((pOVar4->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               id;
    (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    (pOVar4->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar4->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    p_Var3 = (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    (pOVar4->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = &(pOVar4->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var1,&(pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    (pOVar4->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pOVar4->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar4->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               p_Var1);
  }
  pOVar2 = (this->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar4 = (this->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl
                .super__Vector_impl_data._M_start; pOVar4 != pOVar2; pOVar4 = pOVar4 + 1) {
    p_Var3 = (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    pOVar4->version =
         (long)((pOVar4->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               id;
    (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    (pOVar4->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar4->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pOVar4->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    p_Var3 = (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    (pOVar4->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = &(pOVar4->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var1,&(pOVar4->last_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    (pOVar4->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pOVar4->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pOVar4->next_gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               p_Var1);
  }
  std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::clear
            (&this->to_dealloc_after);
  return;
}

Assistant:

void clear() {
        time_stamp = 0;
        execution_memory = 0;
        for (auto &usage: ins) {
            usage.version = usage.operand->id;
            usage.prev_use = usage.next_use = nullptr;
            usage.next_gen = usage.gen = usage.last_use = nullptr;
        }
        for (auto &usage: outs) {
            usage.version = usage.operand->id;
            usage.prev_use = usage.next_use = nullptr;
            usage.next_gen = usage.gen = usage.last_use = nullptr;
        }
        to_dealloc_after.clear();
    }